

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O3

uint32_t duckdb::ParquetCrypto::WriteData
                   (TProtocol *oprot,const_data_ptr_t buffer,uint32_t buffer_size,string *key,
                   EncryptionUtil *encryption_util_p)

{
  EncryptionTransport *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint32_t uVar1;
  TCompactProtocolFactoryT<duckdb::EncryptionTransport> tproto_factory;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> eprot;
  undefined1 local_59;
  EncryptionTransport *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> local_48;
  undefined1 local_38 [16];
  EncryptionTransport *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  local_48.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR__TProtocolFactory_02484e68;
  local_48.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = (EncryptionTransport *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::EncryptionTransport,std::allocator<duckdb::EncryptionTransport>,duckdb_apache::thrift::protocol::TProtocol&,std::__cxx11::string_const&,duckdb::EncryptionUtil_const&>
            (&_Stack_50,&local_58,(allocator<duckdb::EncryptionTransport> *)&local_59,oprot,key,
             encryption_util_p);
  local_28 = local_58;
  p_Stack_20 = _Stack_50._M_pi;
  local_58 = (EncryptionTransport *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::EncryptionTransport>::
  getProtocol((TCompactProtocolFactoryT<duckdb::EncryptionTransport> *)local_38,&local_48);
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  this = *(EncryptionTransport **)(local_38._0_8_ + 8);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_38._0_8_ + 0x10);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (*(this->super_TTransport)._vptr_TTransport[9])(this,buffer,(ulong)buffer_size);
  uVar1 = EncryptionTransport::Finalize(this);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
  }
  duckdb_apache::thrift::protocol::TProtocolFactory::~TProtocolFactory
            ((TProtocolFactory *)&local_48);
  return uVar1;
}

Assistant:

uint32_t ParquetCrypto::WriteData(TProtocol &oprot, const const_data_ptr_t buffer, const uint32_t buffer_size,
                                  const string &key, const EncryptionUtil &encryption_util_p) {
	// FIXME: we know the size upfront so we could do a streaming write instead of this
	// Create encryption protocol
	TCompactProtocolFactoryT<EncryptionTransport> tproto_factory;
	auto eprot = tproto_factory.getProtocol(std::make_shared<EncryptionTransport>(oprot, key, encryption_util_p));
	auto &etrans = reinterpret_cast<EncryptionTransport &>(*eprot->getTransport());

	// Write the data in memory
	etrans.write(buffer, buffer_size);

	// Encrypt and write to oprot
	return etrans.Finalize();
}